

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

ExtPubkey * __thiscall
cfd::core::ExtPrivkey::GetExtPubkey(ExtPubkey *__return_storage_ptr__,ExtPrivkey *this)

{
  CfdException *pCVar1;
  int ret;
  allocator local_131;
  undefined1 local_130 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  ext_key extkey;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,
                     &this->serialize_data_);
  ret = bip32_key_unserialize
                  (local_f8._M_impl.super__Vector_impl_data._M_start,
                   (long)local_f8._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_f8._M_impl.super__Vector_impl_data._M_start,&extkey);
  if (ret != 0) {
    local_130._0_8_ = "cfdcore_hdwallet.cpp";
    local_130._8_4_ = 0x2b5;
    local_130._16_8_ = "GetExtPubkey";
    logger::warn<int&>((CfdSourceLocation *)local_130,"bip32_key_unserialize error. ret={}",&ret);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_130,"ExtPrivkey unserialize error.",(allocator *)&data);
    CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)local_130);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  extkey.priv_key[0] = '\x01';
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,0x4e,
             (allocator_type *)local_130);
  ret = bip32_key_serialize(&extkey,1,
                            data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ByteData::ByteData((ByteData *)local_130,&data);
    ExtPubkey::ExtPubkey(__return_storage_ptr__,(ByteData *)local_130,&this->tweak_sum_);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f8);
    return __return_storage_ptr__;
  }
  local_130._0_8_ = "cfdcore_hdwallet.cpp";
  local_130._8_4_ = 0x2c3;
  local_130._16_8_ = "GetExtPubkey";
  logger::warn<int&>((CfdSourceLocation *)local_130,"GetExtPubkey bip32_key_serialize error. ret={}"
                     ,&ret);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_130,"ExtPrivkey Pubkey serialize error.",&local_131);
  CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)local_130);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPubkey ExtPrivkey::GetExtPubkey() const {
  struct ext_key extkey;

  const std::vector<uint8_t>& serialize_data = serialize_data_.GetBytes();
  int ret = bip32_key_unserialize(
      serialize_data.data(), serialize_data.size(), &extkey);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_unserialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey unserialize error.");
  }

  // copy data
  extkey.priv_key[0] = BIP32_FLAG_KEY_PUBLIC;
  // その他設定の上書きはlibwallyに任せる

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  ret = bip32_key_serialize(
      &extkey, BIP32_FLAG_KEY_PUBLIC, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "GetExtPubkey bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "ExtPrivkey Pubkey serialize error.");
  }

  return ExtPubkey(ByteData(data), tweak_sum_);
}